

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_bpf_reinit__internal(ma_bpf_config *pConfig,void *pHeap,ma_bpf *pBPF,ma_bool32 isNew)

{
  uint uVar1;
  ma_result mVar2;
  size_t local_b8;
  size_t bpf2HeapSizeInBytes;
  undefined1 local_a8 [16];
  double local_98;
  undefined8 local_90;
  double q;
  ma_bpf2_config bpf2Config;
  ma_bpf_heap_layout heapLayout;
  ma_uint32 ibpf2;
  ma_uint32 bpf2Count;
  ma_result result;
  ma_bool32 isNew_local;
  ma_bpf *pBPF_local;
  void *pHeap_local;
  ma_bpf_config *pConfig_local;
  
  if ((pBPF == (ma_bpf *)0x0) || (pConfig == (ma_bpf_config *)0x0)) {
    pConfig_local._4_4_ = MA_INVALID_ARGS;
  }
  else if ((pConfig->format == ma_format_f32) || (pConfig->format == ma_format_s16)) {
    if ((pBPF->format == ma_format_unknown) || (pBPF->format == pConfig->format)) {
      if ((pBPF->channels == 0) || (pBPF->channels == pConfig->channels)) {
        if (pConfig->order < 9) {
          if ((pConfig->order & 1) == 0) {
            uVar1 = pConfig->order >> 1;
            if ((isNew == 0) && (pBPF->bpf2Count != uVar1)) {
              pConfig_local._4_4_ = MA_INVALID_OPERATION;
            }
            else {
              if (isNew == 0) {
                memset(&bpf2Config.q,0,0x10);
              }
              else {
                mVar2 = ma_bpf_get_heap_layout(pConfig,(ma_bpf_heap_layout *)&bpf2Config.q);
                if (mVar2 != MA_SUCCESS) {
                  return mVar2;
                }
                pBPF->_pHeap = pHeap;
                if (bpf2Config.q != 0.0) {
                  memset(pHeap,0,(size_t)bpf2Config.q);
                }
                pBPF->pBPF2 = (ma_bpf2 *)((long)pHeap + heapLayout.sizeInBytes);
              }
              for (heapLayout.bpf2Offset._0_4_ = 0; (uint)heapLayout.bpf2Offset < uVar1;
                  heapLayout.bpf2Offset._0_4_ = (uint)heapLayout.bpf2Offset + 1) {
                local_90 = 0x3fe6a09edbf8b9bb;
                ma_bpf2_config_init((ma_bpf2_config *)&bpf2HeapSizeInBytes,pConfig->format,
                                    pConfig->channels,pConfig->sampleRate,pConfig->cutoffFrequency,
                                    0.707107);
                q = (double)bpf2HeapSizeInBytes;
                bpf2Config.format = local_a8._0_4_;
                bpf2Config.channels = local_a8._4_4_;
                bpf2Config._8_8_ = local_a8._8_8_;
                bpf2Config.cutoffFrequency = local_98;
                if (isNew == 0) {
                  ibpf2 = ma_bpf2_reinit((ma_bpf2_config *)&q,
                                         pBPF->pBPF2 + (uint)heapLayout.bpf2Offset);
                }
                else {
                  ibpf2 = ma_bpf2_get_heap_size((ma_bpf2_config *)&q,&local_b8);
                  if (ibpf2 == MA_SUCCESS) {
                    ibpf2 = ma_bpf2_init_preallocated
                                      ((ma_bpf2_config *)&q,
                                       (void *)((long)pHeap +
                                               heapLayout.sizeInBytes + (ulong)uVar1 * 0x40 +
                                               (uint)heapLayout.bpf2Offset * local_b8),
                                       pBPF->pBPF2 + (uint)heapLayout.bpf2Offset);
                  }
                }
                if (ibpf2 != 0) {
                  return ibpf2;
                }
              }
              pBPF->bpf2Count = uVar1;
              pBPF->format = pConfig->format;
              pBPF->channels = pConfig->channels;
              pConfig_local._4_4_ = MA_SUCCESS;
            }
          }
          else {
            pConfig_local._4_4_ = MA_INVALID_ARGS;
          }
        }
        else {
          pConfig_local._4_4_ = MA_INVALID_ARGS;
        }
      }
      else {
        pConfig_local._4_4_ = MA_INVALID_OPERATION;
      }
    }
    else {
      pConfig_local._4_4_ = MA_INVALID_OPERATION;
    }
  }
  else {
    pConfig_local._4_4_ = MA_INVALID_ARGS;
  }
  return pConfig_local._4_4_;
}

Assistant:

static ma_result ma_bpf_reinit__internal(const ma_bpf_config* pConfig, void* pHeap, ma_bpf* pBPF, ma_bool32 isNew)
{
    ma_result result;
    ma_uint32 bpf2Count;
    ma_uint32 ibpf2;
    ma_bpf_heap_layout heapLayout;  /* Only used if isNew is true. */

    if (pBPF == NULL || pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    /* Only supporting f32 and s16. */
    if (pConfig->format != ma_format_f32 && pConfig->format != ma_format_s16) {
        return MA_INVALID_ARGS;
    }

    /* The format cannot be changed after initialization. */
    if (pBPF->format != ma_format_unknown && pBPF->format != pConfig->format) {
        return MA_INVALID_OPERATION;
    }

    /* The channel count cannot be changed after initialization. */
    if (pBPF->channels != 0 && pBPF->channels != pConfig->channels) {
        return MA_INVALID_OPERATION;
    }

    if (pConfig->order > MA_MAX_FILTER_ORDER) {
        return MA_INVALID_ARGS;
    }

    /* We must have an even number of order. */
    if ((pConfig->order & 0x1) != 0) {
        return MA_INVALID_ARGS;
    }

    bpf2Count = pConfig->order / 2;

    /* The filter order can't change between reinits. */
    if (!isNew) {
        if (pBPF->bpf2Count != bpf2Count) {
            return MA_INVALID_OPERATION;
        }
    }

    if (isNew) {
        result = ma_bpf_get_heap_layout(pConfig, &heapLayout);
        if (result != MA_SUCCESS) {
            return result;
        }

        pBPF->_pHeap = pHeap;
        MA_ZERO_MEMORY(pHeap, heapLayout.sizeInBytes);

        pBPF->pBPF2 = (ma_bpf2*)ma_offset_ptr(pHeap, heapLayout.bpf2Offset);
    } else {
        MA_ZERO_OBJECT(&heapLayout);
    }

    for (ibpf2 = 0; ibpf2 < bpf2Count; ibpf2 += 1) {
        ma_bpf2_config bpf2Config;
        double q;

        /* TODO: Calculate Q to make this a proper Butterworth filter. */
        q = 0.707107;

        bpf2Config = ma_bpf2_config_init(pConfig->format, pConfig->channels, pConfig->sampleRate, pConfig->cutoffFrequency, q);

        if (isNew) {
            size_t bpf2HeapSizeInBytes;

            result = ma_bpf2_get_heap_size(&bpf2Config, &bpf2HeapSizeInBytes);
            if (result == MA_SUCCESS) {
                result = ma_bpf2_init_preallocated(&bpf2Config, ma_offset_ptr(pHeap, heapLayout.bpf2Offset + (sizeof(ma_bpf2) * bpf2Count) + (ibpf2 * bpf2HeapSizeInBytes)), &pBPF->pBPF2[ibpf2]);
            }
        } else {
            result = ma_bpf2_reinit(&bpf2Config, &pBPF->pBPF2[ibpf2]);
        }

        if (result != MA_SUCCESS) {
            return result;
        }
    }

    pBPF->bpf2Count = bpf2Count;
    pBPF->format    = pConfig->format;
    pBPF->channels  = pConfig->channels;

    return MA_SUCCESS;
}